

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O1

int priv_encdec_stub(char *name,_func_int_int_uchar_ptr_uchar_ptr_RSA_ptr_int *func,expbuf_t *buf)

{
  int iVar1;
  char *pcVar2;
  size_t *psVar3;
  size_t key_index;
  uint uVar4;
  RSA *r;
  int *piVar5;
  ulong *puVar6;
  uchar to [4096];
  ulong local_1040;
  uchar local_1038 [4104];
  
  puVar6 = (ulong *)buf->start;
  pcVar2 = buf->end;
  if ((ulong)((long)pcVar2 - (long)puVar6) < 8) {
    puVar6 = (ulong *)0x0;
  }
  else {
    local_1040 = *puVar6;
    puVar6 = puVar6 + 1;
    buf->start = (char *)puVar6;
    if ((ulong)((long)pcVar2 - (long)puVar6) < local_1040) {
      puVar6 = (ulong *)0x0;
    }
    else {
      buf->start = (char *)((long)puVar6 + local_1040);
    }
  }
  if ((puVar6 != (ulong *)0x0) &&
     (psVar3 = (size_t *)buf->start, 7 < (ulong)((long)pcVar2 - (long)psVar3))) {
    key_index = *psVar3;
    buf->start = (char *)(psVar3 + 1);
    piVar5 = (int *)buf->start;
    if (7 < (ulong)((long)pcVar2 - (long)piVar5)) {
      iVar1 = *piVar5;
      buf->start = (char *)(piVar5 + 2);
      r = (RSA *)daemon_get_rsa(key_index);
      if (r == (RSA *)0x0) {
        piVar5 = __errno_location();
        *piVar5 = 0;
        warnf("%s: invalid key index:%zu\n",name,key_index);
        return -1;
      }
      uVar4 = (*func)((int)local_1040,(uchar *)puVar6,local_1038,(RSA *)r,iVar1);
      expbuf_dispose(buf);
      RSA_free(r);
      expbuf_reserve(buf,8);
      *(long *)buf->end = (long)(int)uVar4;
      buf->end = buf->end + 8;
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      expbuf_push_bytes(buf,local_1038,(ulong)uVar4);
      return 0;
    }
  }
  piVar5 = __errno_location();
  *piVar5 = 0;
  warnf("%s: failed to parse request",name);
  return -1;
}

Assistant:

static int priv_encdec_stub(const char *name,
                            int (*func)(int flen, const unsigned char *from, unsigned char *to, RSA *rsa, int padding),
                            struct expbuf_t *buf)
{
    unsigned char *from, to[4096];
    size_t flen;
    size_t key_index, padding;
    RSA *rsa;
    int ret;

    if ((from = expbuf_shift_bytes(buf, &flen)) == NULL || expbuf_shift_num(buf, &key_index) != 0 ||
        expbuf_shift_num(buf, &padding) != 0) {
        errno = 0;
        warnf("%s: failed to parse request", name);
        return -1;
    }
    if ((rsa = daemon_get_rsa(key_index)) == NULL) {
        errno = 0;
        warnf("%s: invalid key index:%zu\n", name, key_index);
        return -1;
    }
    ret = func((int)flen, from, to, rsa, (int)padding);
    expbuf_dispose(buf);
    RSA_free(rsa);

    expbuf_push_num(buf, ret);
    expbuf_push_bytes(buf, to, ret > 0 ? ret : 0);

    return 0;
}